

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bxdfs.cpp
# Opt level: O1

string * __thiscall
pbrt::DiffuseBxDF::ToString_abi_cxx11_(string *__return_storage_ptr__,DiffuseBxDF *this)

{
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  detail::
  stringPrintfRecursive<pbrt::SampledSpectrum_const&,pbrt::SampledSpectrum_const&,float_const&,float_const&>
            (__return_storage_ptr__,"[ DiffuseBxDF R: %s T: %s A: %f B: %f ]",&this->R,&this->T,
             &this->A,&this->B);
  return __return_storage_ptr__;
}

Assistant:

std::string DiffuseBxDF::ToString() const {
    return StringPrintf("[ DiffuseBxDF R: %s T: %s A: %f B: %f ]", R, T, A, B);
}